

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapFields
          (GeneratedMessageReflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  FieldDescriptor *field;
  long lVar3;
  _Base_ptr p_Var4;
  int iVar5;
  uint32 uVar6;
  uint32 uVar7;
  undefined4 extraout_var;
  LogMessage *pLVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  uint uVar11;
  ulong uVar12;
  int oneof_index;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  int local_dc;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_d8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d0;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (message1 != message2) {
    local_d8 = fields;
    iVar5 = (*(message1->super_MessageLite)._vptr_MessageLite[0x16])(message1);
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var,iVar5) != this) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x29d);
      pLVar8 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar8 = LogMessage::operator<<(pLVar8,"First argument to SwapFields() (of type \"");
      iVar5 = (*(message1->super_MessageLite)._vptr_MessageLite[0x17])(message1);
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(CONCAT44(extraout_var_00,iVar5) + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(this->descriptor_ + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar8);
      LogMessage::~LogMessage(&local_68);
    }
    iVar5 = (*(message2->super_MessageLite)._vptr_MessageLite[0x16])();
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var_01,iVar5) != this) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2a4);
      pLVar8 = LogMessage::operator<<
                         (&local_a0,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar8 = LogMessage::operator<<(pLVar8,"Second argument to SwapFields() (of type \"");
      iVar5 = (*(message2->super_MessageLite)._vptr_MessageLite[0x17])();
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(CONCAT44(extraout_var_02,iVar5) + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar8 = LogMessage::operator<<(pLVar8,*(string **)(this->descriptor_ + 8));
      pLVar8 = LogMessage::operator<<
                         (pLVar8,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=((LogFinisher *)&local_d0,pLVar8);
      LogMessage::~LogMessage(&local_a0);
    }
    p_Var1 = &local_d0._M_impl.super__Rb_tree_header;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar11 = (uint)((ulong)((long)(local_d8->
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_d8->
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3);
    local_d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (0 < (int)uVar11) {
      uVar12 = 0;
      do {
        field = (local_d8->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar12];
        if (field[0x50] == (FieldDescriptor)0x1) {
          uVar6 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          uVar7 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          ExtensionSet::SwapExtension
                    ((ExtensionSet *)
                     ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
                     (ExtensionSet *)
                     ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),
                     *(int *)(field + 0x38));
        }
        else {
          lVar3 = *(long *)(field + 0x60);
          if (lVar3 == 0) {
            if (*(int *)(field + 0x4c) != 3) {
              SwapBit(this,message1,message2,field);
            }
            SwapField(this,message1,message2,field);
          }
          else {
            iVar5 = (int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x40)) >> 4);
            local_dc = iVar5 * -0x55555555;
            p_Var9 = &p_Var1->_M_header;
            for (p_Var4 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
                (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                p_Var4 = (&p_Var4->_M_left)[iVar2 < local_dc]) {
              iVar2 = (int)*(size_t *)(p_Var4 + 1);
              if (SBORROW4(iVar2,local_dc) == iVar2 + iVar5 * 0x55555555 < 0) {
                p_Var9 = p_Var4;
              }
            }
            p_Var10 = p_Var1;
            if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
               (p_Var10 = (_Rb_tree_header *)p_Var9,
               local_dc < (int)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
              p_Var10 = p_Var1;
            }
            if (p_Var10 == p_Var1) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_d0,&local_dc);
              SwapOneofField(this,message1,message2,*(OneofDescriptor **)(field + 0x60));
            }
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uVar11 & 0x7fffffff));
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_d0);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SwapFields(
    Message* message1,
    Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
    << "First argument to SwapFields() (of type \""
    << message1->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
    << "Second argument to SwapFields() (of type \""
    << message2->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";

  std::set<int> swapped_oneof;

  const int fields_size = static_cast<int>(fields.size());
  for (int i = 0; i < fields_size; i++) {
    const FieldDescriptor* field = fields[i];
    if (field->is_extension()) {
      MutableExtensionSet(message1)->SwapExtension(
          MutableExtensionSet(message2),
          field->number());
    } else {
      if (field->containing_oneof()) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField(message1, message2, field->containing_oneof());
      } else {
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
        // Swap field.
        SwapField(message1, message2, field);
      }
    }
  }
}